

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::set_motion_vector(Ref<embree::SceneGraph::Node> *node,Vec3fa *dP)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *pNVar4;
  Node *pNVar5;
  ulong uVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  unsigned_long *puVar10;
  Ref<embree::SceneGraph::Node> *in_RSI;
  long *in_RDI;
  Vec3fa *P_5;
  iterator __end9;
  iterator __begin9;
  value_type *__range9;
  avector<Vec3fa> positions1_5;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_5;
  Vec3fx *P_4;
  iterator __end8;
  iterator __begin8;
  value_type *__range8;
  avector<Vec3ff> positions1_4;
  Ref<embree::SceneGraph::PointSetNode> mesh_4;
  Vec3fx *P_3;
  iterator __end7;
  iterator __begin7;
  value_type *__range7;
  avector<Vec3ff> positions1_3;
  Ref<embree::SceneGraph::HairSetNode> mesh_3;
  Vec3fa *P_2;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  avector<Vec3fa> positions1_2;
  Ref<embree::SceneGraph::GridMeshNode> mesh_2;
  Vec3fa *P_1;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  avector<Vec3fa> positions1_1;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  Vec3fa *P;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  avector<Vec3fa> positions1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  Vec3fx v_4;
  Vec3fx v_3;
  Vec3fa v_5;
  Vec3fa v_2;
  Vec3fa v_1;
  Vec3fa v;
  vint4 mask;
  vint4 mask_1;
  size_t i_35;
  size_t i_36;
  size_t i_17;
  size_t i_18;
  size_t i_11;
  size_t i_12;
  size_t i_5;
  size_t i_6;
  size_t i_29;
  size_t i_30;
  size_t i_23;
  size_t i_24;
  size_t i_22;
  size_t i_21;
  Vec3fx *old_items_3;
  size_t i_20;
  size_t i_19;
  size_t i_28;
  size_t i_27;
  Vec3fx *old_items_4;
  size_t i_26;
  size_t i_25;
  size_t new_size_alloced_3;
  size_t new_size_alloced_4;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_10;
  size_t i_9;
  Vec3fa *old_items_1;
  size_t i_8;
  size_t i_7;
  size_t i_16;
  size_t i_15;
  Vec3fa *old_items_2;
  size_t i_14;
  size_t i_13;
  size_t i_34;
  size_t i_33;
  Vec3fa *old_items_5;
  size_t i_32;
  size_t i_31;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  size_t new_size_alloced_2;
  size_t new_size_alloced_5;
  value_type *in_stack_ffffffffffffe808;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_ffffffffffffe810;
  value_type *in_stack_ffffffffffffe818;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_ffffffffffffe820;
  long *local_1708;
  long *local_1660;
  long *local_15d8;
  long *local_1560;
  long *local_14e8;
  long *local_1470;
  long *local_1420;
  Vec3fa *local_13e0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  Vec3fa *local_13b0;
  Vec3fa *local_13a8;
  Vec3fa *local_13a0;
  reference local_1398;
  undefined1 local_1390 [8];
  ulong local_1388;
  ulong local_1380;
  void *local_1378;
  long *local_1370;
  Node *local_1368;
  ulong uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  Vec3fx *local_1340;
  Vec3fx *local_1338;
  Vec3fx *local_1330;
  reference local_1328;
  undefined1 local_1320 [8];
  ulong local_1318;
  ulong local_1310;
  void *local_1308;
  long *local_1300;
  Node *local_12f8;
  ulong uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  Vec3fx *local_12d0;
  Vec3fx *local_12c8;
  Vec3fx *local_12c0;
  reference local_12b8;
  undefined1 local_12b0 [8];
  ulong local_12a8;
  ulong local_12a0;
  void *local_1298;
  long *local_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  Vec3fa *local_1270;
  Vec3fa *local_1268;
  Vec3fa *local_1260;
  reference local_1258;
  undefined1 local_1250 [8];
  ulong local_1248;
  ulong local_1240;
  void *local_1238;
  long *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  Vec3fa *local_1210;
  Vec3fa *local_1208;
  Vec3fa *local_1200;
  reference local_11f8;
  undefined1 local_11f0 [8];
  ulong local_11e8;
  ulong local_11e0;
  void *local_11d8;
  long *local_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  Vec3fa *local_11b8;
  Vec3fa *local_11b0;
  Vec3fa *local_11a8;
  reference local_11a0;
  undefined1 local_1198 [8];
  ulong local_1190;
  ulong local_1188;
  void *local_1180;
  long *local_1178;
  Node *local_1170;
  ulong local_1168;
  long *local_1160;
  long *local_1158;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 *local_10a8;
  undefined1 *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 *local_1080;
  undefined1 *local_1078;
  undefined1 *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  undefined1 *local_1050;
  long **local_1038;
  long **local_1030;
  long **local_1028;
  long **local_1020;
  long **local_1018;
  long **local_1000;
  long **local_ff8;
  long **local_ff0;
  long **local_fe8;
  long **local_fe0;
  long **local_fc8;
  long **local_fc0;
  long **local_fb8;
  long **local_fb0;
  long **local_fa8;
  long **local_f90;
  long **local_f88;
  long **local_f80;
  long **local_f78;
  long **local_f70;
  long **local_f58;
  long **local_f50;
  long **local_f48;
  long **local_f40;
  long **local_f38;
  long **local_f30;
  long **local_f28;
  long **local_f20;
  long **local_f08;
  long **local_f00;
  long **local_ef8;
  long **local_ef0;
  long **local_ee8;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  undefined1 *local_ec8;
  undefined1 *local_ec0;
  reference local_eb8;
  reference local_eb0;
  reference local_ea8;
  reference local_ea0;
  reference local_e98;
  reference local_e90;
  reference local_e88;
  reference local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 *local_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 *local_e48;
  undefined1 *local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 *local_e28;
  undefined1 *local_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 *local_e08;
  undefined1 *local_e00;
  Vec3fa *local_df0;
  undefined8 *local_de8;
  Vec3fa *local_dd8;
  undefined8 *local_dd0;
  Vec3fa *local_dc0;
  undefined8 *local_db8;
  Vec3fa *local_da8;
  undefined8 *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d88;
  undefined1 *local_d78;
  undefined1 *local_d68;
  long **local_d50;
  long **local_d48;
  long **local_d40;
  long **local_d38;
  reference local_d30;
  reference local_d28;
  reference local_d20;
  reference local_d18;
  Node **local_d10;
  Vec3fx *local_d08;
  undefined8 *local_d00;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  undefined8 *local_ce8;
  Node **local_ce0;
  Vec3fx *local_cd8;
  undefined8 *local_cd0;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  undefined8 *local_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  Node *local_c98;
  Node *pNStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  Node *local_c78;
  ulong uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined4 local_c54;
  Node **local_c48;
  Node **local_c40;
  Node *local_c38;
  Node *pNStack_c30;
  Node **local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  Node *local_c08;
  Node *pNStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  Node *local_be8;
  ulong uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined4 local_bc4;
  Node **local_bb8;
  Node **local_bb0;
  Node *local_ba8;
  Node *pNStack_ba0;
  Node **local_b90;
  long **local_b88;
  long *local_b78;
  long **local_b70;
  long *local_b68;
  long **local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  long *local_ad8;
  long **local_ad0;
  long *local_ac8;
  long **local_ac0;
  undefined8 local_ab8;
  ulong uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  ulong uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9f4;
  undefined8 *local_9f0;
  undefined4 local_9e4;
  undefined8 *local_9e0;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9c8;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_9a8;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 *local_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 *local_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 *local_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 *local_888;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined8 *local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined8 *local_808;
  Node **local_800;
  undefined8 *local_7f8;
  Node **local_7f0;
  Node *local_7e8;
  ulong uStack_7e0;
  Node **local_7d0;
  undefined8 *local_7c8;
  Node **local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  Node *local_7a8;
  Node *pNStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_788;
  Node **local_780;
  undefined8 *local_778;
  Node **local_770;
  Node *local_768;
  ulong uStack_760;
  Node **local_750;
  undefined8 *local_748;
  Node **local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  Node *local_728;
  Node *pNStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined4 local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  Node *local_6e8;
  ulong uStack_6e0;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  Node *local_6c8;
  ulong uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  Vec3fa *local_670;
  undefined1 *local_668;
  long *local_660;
  long **local_658;
  long *local_650;
  long **local_648;
  long *local_640;
  long **local_638;
  ulong local_620;
  undefined1 *local_618;
  ulong local_600;
  undefined1 *local_5f8;
  ulong local_5e0;
  undefined1 *local_5d8;
  ulong local_5c0;
  undefined1 *local_5b8;
  ulong local_5b0;
  void *local_5a8;
  undefined1 *local_5a0;
  ulong local_580;
  void *local_578;
  undefined1 *local_570;
  ulong local_550;
  void *local_548;
  undefined1 *local_540;
  ulong local_520;
  void *local_518;
  undefined1 *local_510;
  ulong local_4e0;
  undefined1 *local_4d8;
  ulong local_4c0;
  undefined1 *local_4b8;
  ulong local_4b0;
  void *local_4a8;
  undefined1 *local_4a0;
  ulong local_480;
  void *local_478;
  undefined1 *local_470;
  ulong local_450;
  ulong local_448;
  void *local_440;
  ulong local_438;
  ulong local_430;
  ulong local_428;
  ulong local_420;
  undefined1 *local_418;
  ulong local_410;
  undefined1 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  void *local_3f0;
  void *local_3e8;
  ulong local_3e0;
  void *local_3d8;
  undefined1 *local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  void *local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  undefined1 *local_390;
  ulong local_388;
  undefined1 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  void *local_368;
  void *local_360;
  ulong local_358;
  void *local_350;
  undefined1 *local_348;
  unsigned_long local_340 [2];
  ulong local_330;
  ulong local_328;
  undefined1 *local_320;
  ulong local_318;
  unsigned_long local_310 [2];
  ulong local_300;
  ulong local_2f8;
  undefined1 *local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  void *local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  undefined1 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  void *local_290;
  void *local_288;
  ulong local_280;
  undefined1 *local_278;
  ulong local_270;
  void *local_268;
  undefined1 *local_260;
  ulong local_258;
  ulong local_250;
  void *local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  undefined1 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  void *local_208;
  void *local_200;
  ulong local_1f8;
  undefined1 *local_1f0;
  ulong local_1e8;
  void *local_1e0;
  undefined1 *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  void *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  undefined1 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  void *local_180;
  void *local_178;
  ulong local_170;
  undefined1 *local_168;
  ulong local_160;
  void *local_158;
  undefined1 *local_150;
  ulong local_148;
  ulong local_140;
  void *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  undefined1 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  void *local_f8;
  void *local_f0;
  ulong local_e8;
  undefined1 *local_e0;
  ulong local_d8;
  void *local_d0;
  undefined1 *local_c8;
  unsigned_long local_c0 [2];
  ulong local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  ulong local_98;
  unsigned_long local_90 [2];
  ulong local_80;
  ulong local_78;
  undefined1 *local_70;
  ulong local_68;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  ulong local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  undefined1 *local_10;
  ulong local_8;
  
  local_1068 = &stack0xffffffffffffeec0;
  if (*in_RDI == 0) {
    local_13e0 = (Vec3fa *)0x0;
  }
  else {
    local_13e0 = (Vec3fa *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  local_668 = &stack0xffffffffffffeec0;
  local_670 = local_13e0;
  if (local_13e0 != (Vec3fa *)0x0) {
    (**(code **)(*(long *)&local_13e0->field_0 + 0x10))();
  }
  local_1060 = &stack0xffffffffffffeec0;
  if (local_13e0 == (Vec3fa *)0x0) {
    local_1038 = &local_1160;
    if (*in_RDI == 0) {
      local_1420 = (long *)0x0;
    }
    else {
      local_1420 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
    }
    local_658 = &local_1160;
    local_660 = local_1420;
    local_1160 = local_1420;
    if (local_1420 != (long *)0x0) {
      (**(code **)(*local_1420 + 0x10))();
    }
    local_1030 = &local_1160;
    if (local_1160 == (long *)0x0) {
      local_1000 = &local_1178;
      if (*in_RDI == 0) {
        local_1470 = (long *)0x0;
      }
      else {
        local_1470 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
      }
      local_648 = &local_1178;
      local_650 = local_1470;
      local_1178 = local_1470;
      if (local_1470 != (long *)0x0) {
        (**(code **)(*local_1470 + 0x10))();
      }
      local_ff8 = &local_1178;
      if (local_1178 == (long *)0x0) {
        local_fc8 = &local_11d0;
        if (*in_RDI == 0) {
          local_14e8 = (long *)0x0;
        }
        else {
          local_14e8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        local_b70 = &local_11d0;
        local_b78 = local_14e8;
        local_11d0 = local_14e8;
        if (local_14e8 != (long *)0x0) {
          (**(code **)(*local_14e8 + 0x10))();
        }
        local_fc0 = &local_11d0;
        if (local_11d0 == (long *)0x0) {
          local_d50 = &local_1230;
          if (*in_RDI == 0) {
            local_1560 = (long *)0x0;
          }
          else {
            local_1560 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GridMeshNode::typeinfo,0);
          }
          local_b60 = &local_1230;
          local_b68 = local_1560;
          local_1230 = local_1560;
          if (local_1560 != (long *)0x0) {
            (**(code **)(*local_1560 + 0x10))();
          }
          local_d48 = &local_1230;
          if (local_1230 == (long *)0x0) {
            local_f90 = &local_1290;
            if (*in_RDI == 0) {
              local_15d8 = (long *)0x0;
            }
            else {
              local_15d8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            local_ac0 = &local_1290;
            local_ac8 = local_15d8;
            local_1290 = local_15d8;
            if (local_15d8 != (long *)0x0) {
              (**(code **)(*local_15d8 + 0x10))();
            }
            local_f88 = &local_1290;
            if (local_1290 == (long *)0x0) {
              local_f58 = &local_1300;
              if (*in_RDI == 0) {
                local_1660 = (long *)0x0;
              }
              else {
                local_1660 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo,
                                                    0);
              }
              local_638 = &local_1300;
              local_640 = local_1660;
              local_1300 = local_1660;
              if (local_1660 != (long *)0x0) {
                (**(code **)(*local_1660 + 0x10))();
              }
              local_f50 = &local_1300;
              if (local_1300 == (long *)0x0) {
                local_f08 = &local_1370;
                if (*in_RDI == 0) {
                  local_1708 = (long *)0x0;
                }
                else {
                  local_1708 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                      &SubdivMeshNode::typeinfo,0);
                }
                local_ad0 = &local_1370;
                local_ad8 = local_1708;
                local_1370 = local_1708;
                if (local_1708 != (long *)0x0) {
                  (**(code **)(*local_1708 + 0x10))();
                }
                local_f00 = &local_1370;
                if (local_1370 != (long *)0x0) {
                  local_ec0 = local_1390;
                  local_1388 = 0;
                  local_1380 = 0;
                  local_1378 = (void *)0x0;
                  local_ef0 = &local_1370;
                  local_1398 = std::
                               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               ::back(in_stack_ffffffffffffe810);
                  local_13a8 = local_1398->items + local_1398->size_active;
                  local_eb8 = local_1398;
                  local_e98 = local_1398;
                  for (local_13a0 = local_1398->items; uVar1 = local_1388, local_13a0 != local_13a8;
                      local_13a0 = local_13a0 + 1) {
                    local_13b0 = local_13a0;
                    local_de8 = &local_13c8;
                    local_df0 = local_13a0;
                    uVar2 = *(undefined8 *)&local_13a0->field_0;
                    uVar3 = *(undefined8 *)((long)&local_13a0->field_0 + 8);
                    pNVar4 = in_RSI->ptr;
                    pNVar5 = in_RSI[1].ptr;
                    local_a08._0_4_ = (float)uVar2;
                    local_a08._4_4_ = (float)((ulong)uVar2 >> 0x20);
                    uStack_a00._0_4_ = (float)uVar3;
                    uStack_a00._4_4_ = (float)((ulong)uVar3 >> 0x20);
                    local_a18._0_4_ = SUB84(pNVar4,0);
                    local_a18._4_4_ = (float)((ulong)pNVar4 >> 0x20);
                    uStack_a10._0_4_ = SUB84(pNVar5,0);
                    uStack_a10._4_4_ = (float)((ulong)pNVar5 >> 0x20);
                    local_898 = (float)local_a08 + (float)local_a18;
                    fStack_894 = local_a08._4_4_ + local_a18._4_4_;
                    fStack_890 = (float)uStack_a00 + (float)uStack_a10;
                    fStack_88c = uStack_a00._4_4_ + uStack_a10._4_4_;
                    local_888 = &local_13c8;
                    local_13c8 = CONCAT44(fStack_894,local_898);
                    uStack_13c0 = CONCAT44(fStack_88c,fStack_890);
                    local_e68 = &local_13c8;
                    local_ae0 = &local_e78;
                    local_18 = local_1388 + 1;
                    local_e60 = local_1390;
                    local_ae8 = local_e68;
                    local_a18 = pNVar4;
                    uStack_a10 = pNVar5;
                    local_a08 = uVar2;
                    uStack_a00 = uVar3;
                    local_10 = local_1390;
                    local_e78 = local_13c8;
                    uStack_e70 = uStack_13c0;
                    if (local_1380 < local_18) {
                      uVar6 = local_18;
                      if (local_1380 != 0) {
                        local_20 = local_1380;
                        while (local_20 < local_18) {
                          local_30[1] = 1;
                          local_30[0] = local_20 << 1;
                          puVar10 = std::max<unsigned_long>(local_30 + 1,local_30);
                          local_20 = *puVar10;
                        }
                        local_8 = local_20;
                        uVar6 = local_8;
                      }
                    }
                    else {
                      uVar6 = local_1380;
                    }
                    local_8 = uVar6;
                    local_120 = local_8;
                    uVar6 = uVar1;
                    uVar7 = local_1388;
                    if (uVar1 < local_1388) {
                      while (local_128 = uVar6, uVar7 = uVar1, local_128 < local_1388) {
                        uVar6 = local_128 + 1;
                      }
                    }
                    local_1388 = uVar7;
                    local_110 = local_1390;
                    if (local_8 == local_1380) {
                      for (local_130 = local_1388; local_1388 = uVar1, local_130 < uVar1;
                          local_130 = local_130 + 1) {
                        local_f8 = (void *)((long)local_1378 + local_130 * 0x10);
                      }
                    }
                    else {
                      local_138 = local_1378;
                      local_e8 = local_8;
                      local_118 = uVar1;
                      local_e0 = local_1390;
                      local_1378 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                                 (size_t)in_stack_ffffffffffffe810);
                      for (local_140 = 0; local_140 < local_1388; local_140 = local_140 + 1) {
                        local_100 = (undefined8 *)((long)local_1378 + local_140 * 0x10);
                        local_108 = (undefined8 *)((long)local_138 + local_140 * 0x10);
                        uVar2 = local_108[1];
                        *local_100 = *local_108;
                        local_100[1] = uVar2;
                      }
                      for (local_148 = local_1388; local_148 < local_118; local_148 = local_148 + 1)
                      {
                        local_f0 = (void *)((long)local_1378 + local_148 * 0x10);
                      }
                      local_d8 = local_1380;
                      local_d0 = local_138;
                      local_c8 = local_1390;
                      alignedFree(in_stack_ffffffffffffe808);
                      local_1388 = local_118;
                      local_1380 = local_120;
                    }
                    local_af0 = (undefined8 *)((long)local_1378 + local_1388 * 0x10);
                    local_af8 = &local_e78;
                    *local_af0 = local_e78;
                    local_af0[1] = uStack_e70;
                    local_118 = local_1388;
                    local_1388 = local_1388 + 1;
                  }
                  local_ef8 = &local_1370;
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::push_back(in_stack_ffffffffffffe810,(value_type *)in_stack_ffffffffffffe808);
                  local_d68 = local_1390;
                  for (local_620 = 0; local_620 < local_1388; local_620 = local_620 + 1) {
                  }
                  local_520 = local_1380;
                  local_518 = local_1378;
                  local_618 = local_d68;
                  local_510 = local_d68;
                  alignedFree(in_stack_ffffffffffffe808);
                  local_1378 = (void *)0x0;
                  local_1380 = 0;
                  local_1388 = 0;
                }
                local_ee8 = &local_1370;
                if (local_1370 != (long *)0x0) {
                  (**(code **)(*local_1370 + 0x18))();
                }
              }
              else {
                local_1318 = 0;
                local_1310 = 0;
                local_1308 = (void *)0x0;
                local_f28 = &local_1300;
                local_1328 = std::
                             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             ::back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     *)in_stack_ffffffffffffe810);
                local_1338 = local_1328->items + local_1328->size_active;
                local_d30 = local_1328;
                local_d20 = local_1328;
                for (local_1330 = local_1328->items; uVar1 = local_1318, local_1330 != local_1338;
                    local_1330 = local_1330 + 1) {
                  local_1340 = local_1330;
                  local_bb8 = &local_1368;
                  local_bc4 = 0;
                  local_870 = &local_bd8;
                  local_874 = 0xffffffff;
                  local_878 = 0xffffffff;
                  local_87c = 0xffffffff;
                  local_880 = 0;
                  local_844 = 0;
                  local_848 = 0xffffffff;
                  local_84c = 0xffffffff;
                  local_850 = 0xffffffff;
                  local_868 = 0xffffffffffffffff;
                  uStack_860 = 0xffffffff;
                  local_bd8 = 0xffffffffffffffff;
                  uStack_bd0 = 0xffffffff;
                  local_958 = 0xffffffffffffffff;
                  uStack_950 = 0xffffffff;
                  local_940 = &local_bf8;
                  local_bf8 = 0xffffffffffffffff;
                  uStack_bf0 = 0xffffffff;
                  local_ba8 = in_RSI->ptr;
                  pNStack_ba0 = in_RSI[1].ptr;
                  local_b90 = &local_c08;
                  local_9f0 = &local_c18;
                  local_9f4 = 0;
                  local_9a8 = 0;
                  local_9b8 = 0;
                  uStack_9b4 = 0;
                  uStack_9b0 = 0;
                  uStack_9ac = 0;
                  local_698 = 0;
                  uStack_690 = 0;
                  local_c18 = 0;
                  uStack_c10 = 0;
                  local_7f0 = &local_be8;
                  local_7f8 = &local_bf8;
                  local_800 = &local_c08;
                  local_808 = &local_c18;
                  local_798 = 0xffffffffffffffff;
                  uStack_790 = 0xffffffff;
                  uStack_7e0 = (ulong)pNStack_ba0 & 0xffffffff;
                  local_688 = 0xffffffffffffffff;
                  uStack_680 = 0xffffffff;
                  local_6d8 = 0;
                  uStack_6d4 = 0;
                  uStack_6d0 = 0;
                  uStack_6cc = 0;
                  local_7d0 = &local_be8;
                  local_bb0 = &local_be8;
                  local_d00 = &local_1358;
                  local_d08 = local_1330;
                  local_d10 = &local_1368;
                  uVar2 = *(undefined8 *)&local_1330->field_0;
                  uVar3 = *(undefined8 *)((long)&local_1330->field_0 + 8);
                  local_a88._0_4_ = (float)uVar2;
                  local_a88._4_4_ = (float)((ulong)uVar2 >> 0x20);
                  uStack_a80._0_4_ = (float)uVar3;
                  uStack_a80._4_4_ = (float)((ulong)uVar3 >> 0x20);
                  local_a98._0_4_ = SUB84(local_ba8,0);
                  local_a98._4_4_ = (float)((ulong)local_ba8 >> 0x20);
                  uStack_a90._0_4_ = SUB84(pNStack_ba0,0);
                  local_cf8 = (float)local_a88 + (float)local_a98;
                  fStack_cf4 = local_a88._4_4_ + local_a98._4_4_;
                  fStack_cf0 = (float)uStack_a80 + (float)uStack_a90;
                  fStack_cec = uStack_a80._4_4_ + 0.0;
                  local_ce8 = &local_1358;
                  local_1358 = CONCAT44(fStack_cf4,local_cf8);
                  uStack_1350 = CONCAT44(fStack_cec,fStack_cf0);
                  local_10a8 = &local_1358;
                  local_960 = &local_10b8;
                  local_2f8 = local_1318 + 1;
                  local_10a0 = local_1320;
                  local_a98 = local_ba8;
                  uStack_a90 = uStack_7e0;
                  local_a88 = uVar2;
                  uStack_a80 = uVar3;
                  local_968 = local_10a8;
                  local_918 = local_958;
                  uStack_910 = uStack_950;
                  local_7e8 = local_ba8;
                  local_7c8 = local_808;
                  local_7c0 = local_800;
                  local_7b8 = local_7f8;
                  local_7b0 = local_7f8;
                  local_7a8 = local_ba8;
                  pNStack_7a0 = pNStack_ba0;
                  local_708 = local_870;
                  local_6c8 = local_ba8;
                  uStack_6c0 = uStack_7e0;
                  local_2f0 = local_1320;
                  local_1368 = local_ba8;
                  uStack_1360 = uStack_7e0;
                  local_10b8 = local_1358;
                  uStack_10b0 = uStack_1350;
                  local_c08 = local_ba8;
                  pNStack_c00 = pNStack_ba0;
                  local_be8 = local_ba8;
                  uStack_be0 = uStack_7e0;
                  if (local_1310 < local_2f8) {
                    uVar2 = 0;
                    uVar3 = 0;
                    uVar6 = local_2f8;
                    if (local_1310 != 0) {
                      local_300 = local_1310;
                      local_c18 = local_698;
                      uStack_c10 = uStack_690;
                      while (local_300 < local_2f8) {
                        local_310[1] = 1;
                        local_310[0] = local_300 << 1;
                        puVar10 = std::max<unsigned_long>(local_310 + 1,local_310);
                        local_300 = *puVar10;
                      }
                      local_2e8 = local_300;
                      uVar2 = local_698;
                      uVar3 = uStack_690;
                      uVar6 = local_2e8;
                    }
                  }
                  else {
                    uVar2 = local_698;
                    uVar3 = uStack_690;
                    uVar6 = local_1310;
                    local_c18 = local_698;
                    uStack_c10 = uStack_690;
                  }
                  local_2e8 = uVar6;
                  uStack_690 = uVar3;
                  local_698 = uVar2;
                  local_3a0 = local_2e8;
                  uVar6 = uVar1;
                  uVar7 = local_1318;
                  if (uVar1 < local_1318) {
                    while (local_3a8 = uVar6, uVar7 = uVar1, local_3a8 < local_1318) {
                      uVar6 = local_3a8 + 1;
                    }
                  }
                  local_1318 = uVar7;
                  local_390 = local_1320;
                  if (local_2e8 == local_1310) {
                    for (local_3b0 = local_1318; local_1318 = uVar1, local_3b0 < uVar1;
                        local_3b0 = local_3b0 + 1) {
                      local_368 = (void *)((long)local_1308 + local_3b0 * 0x10);
                    }
                  }
                  else {
                    local_3b8 = local_1308;
                    local_388 = local_2e8;
                    local_398 = uVar1;
                    local_380 = local_1320;
                    local_1308 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                               (size_t)in_stack_ffffffffffffe810);
                    for (local_3c0 = 0; local_3c0 < local_1318; local_3c0 = local_3c0 + 1) {
                      local_370 = (undefined8 *)((long)local_1308 + local_3c0 * 0x10);
                      local_378 = (undefined8 *)((long)local_3b8 + local_3c0 * 0x10);
                      uVar2 = local_378[1];
                      *local_370 = *local_378;
                      local_370[1] = uVar2;
                    }
                    for (local_3c8 = local_1318; local_3c8 < local_398; local_3c8 = local_3c8 + 1) {
                      local_360 = (void *)((long)local_1308 + local_3c8 * 0x10);
                    }
                    local_358 = local_1310;
                    local_350 = local_3b8;
                    local_348 = local_1320;
                    alignedFree(in_stack_ffffffffffffe808);
                    local_1318 = local_398;
                    local_1310 = local_3a0;
                  }
                  local_970 = (undefined8 *)((long)local_1308 + local_1318 * 0x10);
                  local_978 = &local_10b8;
                  *local_970 = local_10b8;
                  local_970[1] = uStack_10b0;
                  local_398 = local_1318;
                  local_1318 = local_1318 + 1;
                }
                local_f30 = &local_1300;
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
                local_f38 = &local_1300;
                sVar9 = std::
                        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_1300 + 0x12));
                if (sVar9 != 0) {
                  local_f40 = &local_1300;
                  local_f48 = &local_1300;
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_1300 + 0x12),0);
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::push_back(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
                }
                local_4d8 = local_1320;
                for (local_4e0 = 0; local_4e0 < local_1318; local_4e0 = local_4e0 + 1) {
                }
                local_480 = local_1310;
                local_478 = local_1308;
                local_470 = local_4d8;
                alignedFree(in_stack_ffffffffffffe808);
                local_1308 = (void *)0x0;
                local_1310 = 0;
                local_1318 = 0;
              }
              local_f20 = &local_1300;
              if (local_1300 != (long *)0x0) {
                (**(code **)(*local_1300 + 0x18))();
              }
            }
            else {
              local_12a8 = 0;
              local_12a0 = 0;
              local_1298 = (void *)0x0;
              local_f78 = &local_1290;
              local_12b8 = std::
                           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           ::back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                   *)in_stack_ffffffffffffe810);
              local_12c8 = local_12b8->items + local_12b8->size_active;
              local_d28 = local_12b8;
              local_d18 = local_12b8;
              for (local_12c0 = local_12b8->items; uVar1 = local_12a8, local_12c0 != local_12c8;
                  local_12c0 = local_12c0 + 1) {
                local_12d0 = local_12c0;
                local_c48 = &local_12f8;
                local_c54 = 0;
                local_830 = &local_c68;
                local_834 = 0xffffffff;
                local_838 = 0xffffffff;
                local_83c = 0xffffffff;
                local_840 = 0;
                local_80c = 0;
                local_810 = 0xffffffff;
                local_814 = 0xffffffff;
                local_818 = 0xffffffff;
                local_828 = 0xffffffffffffffff;
                uStack_820 = 0xffffffff;
                local_c68 = 0xffffffffffffffff;
                uStack_c60 = 0xffffffff;
                local_938 = 0xffffffffffffffff;
                uStack_930 = 0xffffffff;
                local_920 = &local_c88;
                local_c88 = 0xffffffffffffffff;
                uStack_c80 = 0xffffffff;
                local_c38 = in_RSI->ptr;
                pNStack_c30 = in_RSI[1].ptr;
                local_c20 = &local_c98;
                local_9e0 = &local_ca8;
                local_9e4 = 0;
                local_9c8 = 0;
                local_9d8 = 0;
                uStack_9d4 = 0;
                uStack_9d0 = 0;
                uStack_9cc = 0;
                local_6b8 = 0;
                uStack_6b0 = 0;
                local_ca8 = 0;
                uStack_ca0 = 0;
                local_770 = &local_c78;
                local_778 = &local_c88;
                local_780 = &local_c98;
                local_788 = &local_ca8;
                local_718 = 0xffffffffffffffff;
                uStack_710 = 0xffffffff;
                uStack_760 = (ulong)pNStack_c30 & 0xffffffff;
                local_6a8 = 0xffffffffffffffff;
                uStack_6a0 = 0xffffffff;
                local_6f8 = 0;
                uStack_6f4 = 0;
                uStack_6f0 = 0;
                uStack_6ec = 0;
                local_750 = &local_c78;
                local_c40 = &local_c78;
                local_cd0 = &local_12e8;
                local_cd8 = local_12c0;
                local_ce0 = &local_12f8;
                uVar2 = *(undefined8 *)&local_12c0->field_0;
                uVar3 = *(undefined8 *)((long)&local_12c0->field_0 + 8);
                local_aa8._0_4_ = (float)uVar2;
                local_aa8._4_4_ = (float)((ulong)uVar2 >> 0x20);
                uStack_aa0._0_4_ = (float)uVar3;
                uStack_aa0._4_4_ = (float)((ulong)uVar3 >> 0x20);
                local_ab8._0_4_ = SUB84(local_c38,0);
                local_ab8._4_4_ = (float)((ulong)local_c38 >> 0x20);
                uStack_ab0._0_4_ = SUB84(pNStack_c30,0);
                local_cc8 = (float)local_aa8 + (float)local_ab8;
                fStack_cc4 = local_aa8._4_4_ + local_ab8._4_4_;
                fStack_cc0 = (float)uStack_aa0 + (float)uStack_ab0;
                fStack_cbc = uStack_aa0._4_4_ + 0.0;
                local_cb0 = &local_12e8;
                local_12e8 = CONCAT44(fStack_cc4,local_cc8);
                uStack_12e0 = CONCAT44(fStack_cbc,fStack_cc0);
                local_1080 = &local_12e8;
                local_980 = &local_1098;
                local_328 = local_12a8 + 1;
                local_1078 = local_12b0;
                local_ab8 = local_c38;
                uStack_ab0 = uStack_760;
                local_aa8 = uVar2;
                uStack_aa0 = uVar3;
                local_988 = local_1080;
                local_908 = local_938;
                uStack_900 = uStack_930;
                local_768 = local_c38;
                local_748 = local_788;
                local_740 = local_780;
                local_738 = local_778;
                local_730 = local_778;
                local_728 = local_c38;
                pNStack_720 = pNStack_c30;
                local_700 = local_830;
                local_6e8 = local_c38;
                uStack_6e0 = uStack_760;
                local_320 = local_12b0;
                local_12f8 = local_c38;
                uStack_12f0 = uStack_760;
                local_1098 = local_12e8;
                uStack_1090 = uStack_12e0;
                local_c98 = local_c38;
                pNStack_c90 = pNStack_c30;
                local_c78 = local_c38;
                uStack_c70 = uStack_760;
                if (local_12a0 < local_328) {
                  uVar2 = 0;
                  uVar3 = 0;
                  uVar6 = local_328;
                  if (local_12a0 != 0) {
                    local_330 = local_12a0;
                    local_ca8 = local_6b8;
                    uStack_ca0 = uStack_6b0;
                    while (local_330 < local_328) {
                      local_340[1] = 1;
                      local_340[0] = local_330 << 1;
                      puVar10 = std::max<unsigned_long>(local_340 + 1,local_340);
                      local_330 = *puVar10;
                    }
                    local_318 = local_330;
                    uVar2 = local_6b8;
                    uVar3 = uStack_6b0;
                    uVar6 = local_318;
                  }
                }
                else {
                  uVar2 = local_6b8;
                  uVar3 = uStack_6b0;
                  uVar6 = local_12a0;
                  local_ca8 = local_6b8;
                  uStack_ca0 = uStack_6b0;
                }
                local_318 = uVar6;
                uStack_6b0 = uVar3;
                local_6b8 = uVar2;
                local_428 = local_318;
                uVar6 = uVar1;
                uVar7 = local_12a8;
                if (uVar1 < local_12a8) {
                  while (local_430 = uVar6, uVar7 = uVar1, local_430 < local_12a8) {
                    uVar6 = local_430 + 1;
                  }
                }
                local_12a8 = uVar7;
                local_418 = local_12b0;
                if (local_318 == local_12a0) {
                  for (local_438 = local_12a8; local_12a8 = uVar1, local_438 < uVar1;
                      local_438 = local_438 + 1) {
                    local_3f0 = (void *)((long)local_1298 + local_438 * 0x10);
                  }
                }
                else {
                  local_440 = local_1298;
                  local_410 = local_318;
                  local_420 = uVar1;
                  local_408 = local_12b0;
                  local_1298 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                             (size_t)in_stack_ffffffffffffe810);
                  for (local_448 = 0; local_448 < local_12a8; local_448 = local_448 + 1) {
                    local_3f8 = (undefined8 *)((long)local_1298 + local_448 * 0x10);
                    local_400 = (undefined8 *)((long)local_440 + local_448 * 0x10);
                    uVar2 = local_400[1];
                    *local_3f8 = *local_400;
                    local_3f8[1] = uVar2;
                  }
                  for (local_450 = local_12a8; local_450 < local_420; local_450 = local_450 + 1) {
                    local_3e8 = (void *)((long)local_1298 + local_450 * 0x10);
                  }
                  local_3e0 = local_12a0;
                  local_3d8 = local_440;
                  local_3d0 = local_12b0;
                  alignedFree(in_stack_ffffffffffffe808);
                  local_12a8 = local_420;
                  local_12a0 = local_428;
                }
                local_990 = (undefined8 *)((long)local_1298 + local_12a8 * 0x10);
                local_998 = &local_1098;
                *local_990 = local_1098;
                local_990[1] = uStack_1090;
                local_420 = local_12a8;
                local_12a8 = local_12a8 + 1;
              }
              local_f80 = &local_1290;
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
              local_4b8 = local_12b0;
              for (local_4c0 = 0; local_4c0 < local_12a8; local_4c0 = local_4c0 + 1) {
              }
              local_4b0 = local_12a0;
              local_4a8 = local_1298;
              local_4a0 = local_4b8;
              alignedFree(in_stack_ffffffffffffe808);
              local_1298 = (void *)0x0;
              local_12a0 = 0;
              local_12a8 = 0;
            }
            local_f70 = &local_1290;
            if (local_1290 != (long *)0x0) {
              (**(code **)(*local_1290 + 0x18))();
            }
          }
          else {
            local_ec8 = local_1250;
            local_1248 = 0;
            local_1240 = 0;
            local_1238 = (void *)0x0;
            local_d38 = &local_1230;
            local_1258 = std::
                         vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ::back(in_stack_ffffffffffffe810);
            local_1268 = local_1258->items + local_1258->size_active;
            local_eb0 = local_1258;
            local_e90 = local_1258;
            for (local_1260 = local_1258->items; uVar1 = local_1248, local_1260 != local_1268;
                local_1260 = local_1260 + 1) {
              local_1270 = local_1260;
              local_dd0 = &local_1288;
              local_dd8 = local_1260;
              uVar2 = *(undefined8 *)&local_1260->field_0;
              uVar3 = *(undefined8 *)((long)&local_1260->field_0 + 8);
              pNVar4 = in_RSI->ptr;
              pNVar5 = in_RSI[1].ptr;
              local_a28._0_4_ = (float)uVar2;
              local_a28._4_4_ = (float)((ulong)uVar2 >> 0x20);
              uStack_a20._0_4_ = (float)uVar3;
              uStack_a20._4_4_ = (float)((ulong)uVar3 >> 0x20);
              local_a38._0_4_ = SUB84(pNVar4,0);
              local_a38._4_4_ = (float)((ulong)pNVar4 >> 0x20);
              uStack_a30._0_4_ = SUB84(pNVar5,0);
              uStack_a30._4_4_ = (float)((ulong)pNVar5 >> 0x20);
              local_8b8 = (float)local_a28 + (float)local_a38;
              fStack_8b4 = local_a28._4_4_ + local_a38._4_4_;
              fStack_8b0 = (float)uStack_a20 + (float)uStack_a30;
              fStack_8ac = uStack_a20._4_4_ + uStack_a30._4_4_;
              local_8a0 = &local_1288;
              local_1288 = CONCAT44(fStack_8b4,local_8b8);
              uStack_1280 = CONCAT44(fStack_8ac,fStack_8b0);
              local_e48 = &local_1288;
              local_b00 = &local_e58;
              local_48 = local_1248 + 1;
              local_e40 = local_1250;
              local_b08 = local_e48;
              local_a38 = pNVar4;
              uStack_a30 = pNVar5;
              local_a28 = uVar2;
              uStack_a20 = uVar3;
              local_40 = local_1250;
              local_e58 = local_1288;
              uStack_e50 = uStack_1280;
              if (local_1240 < local_48) {
                uVar6 = local_48;
                if (local_1240 != 0) {
                  local_50 = local_1240;
                  while (local_50 < local_48) {
                    local_60[1] = 1;
                    local_60[0] = local_50 << 1;
                    puVar10 = std::max<unsigned_long>(local_60 + 1,local_60);
                    local_50 = *puVar10;
                  }
                  local_38 = local_50;
                  uVar6 = local_38;
                }
              }
              else {
                uVar6 = local_1240;
              }
              local_38 = uVar6;
              local_1a8 = local_38;
              uVar6 = uVar1;
              uVar7 = local_1248;
              if (uVar1 < local_1248) {
                while (local_1b0 = uVar6, uVar7 = uVar1, local_1b0 < local_1248) {
                  uVar6 = local_1b0 + 1;
                }
              }
              local_1248 = uVar7;
              local_198 = local_1250;
              if (local_38 == local_1240) {
                for (local_1b8 = local_1248; local_1248 = uVar1, local_1b8 < uVar1;
                    local_1b8 = local_1b8 + 1) {
                  local_180 = (void *)((long)local_1238 + local_1b8 * 0x10);
                }
              }
              else {
                local_1c0 = local_1238;
                local_170 = local_38;
                local_1a0 = uVar1;
                local_168 = local_1250;
                local_1238 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                           (size_t)in_stack_ffffffffffffe810);
                for (local_1c8 = 0; local_1c8 < local_1248; local_1c8 = local_1c8 + 1) {
                  local_188 = (undefined8 *)((long)local_1238 + local_1c8 * 0x10);
                  local_190 = (undefined8 *)((long)local_1c0 + local_1c8 * 0x10);
                  uVar2 = local_190[1];
                  *local_188 = *local_190;
                  local_188[1] = uVar2;
                }
                for (local_1d0 = local_1248; local_1d0 < local_1a0; local_1d0 = local_1d0 + 1) {
                  local_178 = (void *)((long)local_1238 + local_1d0 * 0x10);
                }
                local_160 = local_1240;
                local_158 = local_1c0;
                local_150 = local_1250;
                alignedFree(in_stack_ffffffffffffe808);
                local_1248 = local_1a0;
                local_1240 = local_1a8;
              }
              local_b10 = (undefined8 *)((long)local_1238 + local_1248 * 0x10);
              local_b18 = &local_e58;
              *local_b10 = local_e58;
              local_b10[1] = uStack_e50;
              local_1a0 = local_1248;
              local_1248 = local_1248 + 1;
            }
            local_d40 = &local_1230;
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::push_back(in_stack_ffffffffffffe810,(value_type *)in_stack_ffffffffffffe808);
            local_d78 = local_1250;
            for (local_600 = 0; local_600 < local_1248; local_600 = local_600 + 1) {
            }
            local_550 = local_1240;
            local_548 = local_1238;
            local_5f8 = local_d78;
            local_540 = local_d78;
            alignedFree(in_stack_ffffffffffffe808);
            local_1238 = (void *)0x0;
            local_1240 = 0;
            local_1248 = 0;
          }
          local_b88 = &local_1230;
          if (local_1230 != (long *)0x0) {
            (**(code **)(*local_1230 + 0x18))();
          }
        }
        else {
          local_ed0 = local_11f0;
          local_11e8 = 0;
          local_11e0 = 0;
          local_11d8 = (void *)0x0;
          local_fb0 = &local_11d0;
          local_11f8 = std::
                       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       ::back(in_stack_ffffffffffffe810);
          local_1208 = local_11f8->items + local_11f8->size_active;
          local_ea8 = local_11f8;
          local_e88 = local_11f8;
          for (local_1200 = local_11f8->items; uVar1 = local_11e8, local_1200 != local_1208;
              local_1200 = local_1200 + 1) {
            local_1210 = local_1200;
            local_db8 = &local_1228;
            local_dc0 = local_1200;
            uVar2 = *(undefined8 *)&local_1200->field_0;
            uVar3 = *(undefined8 *)((long)&local_1200->field_0 + 8);
            pNVar4 = in_RSI->ptr;
            pNVar5 = in_RSI[1].ptr;
            local_a48._0_4_ = (float)uVar2;
            local_a48._4_4_ = (float)((ulong)uVar2 >> 0x20);
            uStack_a40._0_4_ = (float)uVar3;
            uStack_a40._4_4_ = (float)((ulong)uVar3 >> 0x20);
            local_a58._0_4_ = SUB84(pNVar4,0);
            local_a58._4_4_ = (float)((ulong)pNVar4 >> 0x20);
            uStack_a50._0_4_ = SUB84(pNVar5,0);
            uStack_a50._4_4_ = (float)((ulong)pNVar5 >> 0x20);
            local_8d8 = (float)local_a48 + (float)local_a58;
            fStack_8d4 = local_a48._4_4_ + local_a58._4_4_;
            fStack_8d0 = (float)uStack_a40 + (float)uStack_a50;
            fStack_8cc = uStack_a40._4_4_ + uStack_a50._4_4_;
            local_8c0 = &local_1228;
            local_1228 = CONCAT44(fStack_8d4,local_8d8);
            uStack_1220 = CONCAT44(fStack_8cc,fStack_8d0);
            local_e28 = &local_1228;
            local_b20 = &local_e38;
            local_78 = local_11e8 + 1;
            local_e20 = local_11f0;
            local_b28 = local_e28;
            local_a58 = pNVar4;
            uStack_a50 = pNVar5;
            local_a48 = uVar2;
            uStack_a40 = uVar3;
            local_70 = local_11f0;
            local_e38 = local_1228;
            uStack_e30 = uStack_1220;
            if (local_11e0 < local_78) {
              uVar6 = local_78;
              if (local_11e0 != 0) {
                local_80 = local_11e0;
                while (local_80 < local_78) {
                  local_90[1] = 1;
                  local_90[0] = local_80 << 1;
                  puVar10 = std::max<unsigned_long>(local_90 + 1,local_90);
                  local_80 = *puVar10;
                }
                local_68 = local_80;
                uVar6 = local_68;
              }
            }
            else {
              uVar6 = local_11e0;
            }
            local_68 = uVar6;
            local_230 = local_68;
            uVar6 = uVar1;
            uVar7 = local_11e8;
            if (uVar1 < local_11e8) {
              while (local_238 = uVar6, uVar7 = uVar1, local_238 < local_11e8) {
                uVar6 = local_238 + 1;
              }
            }
            local_11e8 = uVar7;
            local_220 = local_11f0;
            if (local_68 == local_11e0) {
              for (local_240 = local_11e8; local_11e8 = uVar1, local_240 < uVar1;
                  local_240 = local_240 + 1) {
                local_208 = (void *)((long)local_11d8 + local_240 * 0x10);
              }
            }
            else {
              local_248 = local_11d8;
              local_1f8 = local_68;
              local_228 = uVar1;
              local_1f0 = local_11f0;
              local_11d8 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                         (size_t)in_stack_ffffffffffffe810);
              for (local_250 = 0; local_250 < local_11e8; local_250 = local_250 + 1) {
                local_210 = (undefined8 *)((long)local_11d8 + local_250 * 0x10);
                local_218 = (undefined8 *)((long)local_248 + local_250 * 0x10);
                uVar2 = local_218[1];
                *local_210 = *local_218;
                local_210[1] = uVar2;
              }
              for (local_258 = local_11e8; local_258 < local_228; local_258 = local_258 + 1) {
                local_200 = (void *)((long)local_11d8 + local_258 * 0x10);
              }
              local_1e8 = local_11e0;
              local_1e0 = local_248;
              local_1d8 = local_11f0;
              alignedFree(in_stack_ffffffffffffe808);
              local_11e8 = local_228;
              local_11e0 = local_230;
            }
            local_b30 = (undefined8 *)((long)local_11d8 + local_11e8 * 0x10);
            local_b38 = &local_e38;
            *local_b30 = local_e38;
            local_b30[1] = uStack_e30;
            local_228 = local_11e8;
            local_11e8 = local_11e8 + 1;
          }
          local_fb8 = &local_11d0;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(in_stack_ffffffffffffe810,(value_type *)in_stack_ffffffffffffe808);
          local_d88 = local_11f0;
          for (local_5e0 = 0; local_5e0 < local_11e8; local_5e0 = local_5e0 + 1) {
          }
          local_580 = local_11e0;
          local_578 = local_11d8;
          local_5d8 = local_d88;
          local_570 = local_d88;
          alignedFree(in_stack_ffffffffffffe808);
          local_11d8 = (void *)0x0;
          local_11e0 = 0;
          local_11e8 = 0;
        }
        local_fa8 = &local_11d0;
        if (local_11d0 != (long *)0x0) {
          (**(code **)(*local_11d0 + 0x18))();
        }
      }
      else {
        local_ed8 = local_1198;
        local_1190 = 0;
        local_1188 = 0;
        local_1180 = (void *)0x0;
        local_fe8 = &local_1178;
        local_11a0 = std::
                     vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ::back(in_stack_ffffffffffffe810);
        local_11b0 = local_11a0->items + local_11a0->size_active;
        local_ea0 = local_11a0;
        local_e80 = local_11a0;
        for (local_11a8 = local_11a0->items; uVar1 = local_1190, local_11a8 != local_11b0;
            local_11a8 = local_11a8 + 1) {
          local_11b8 = local_11a8;
          local_da0 = &local_11c8;
          local_da8 = local_11a8;
          uVar2 = *(undefined8 *)&local_11a8->field_0;
          uVar3 = *(undefined8 *)((long)&local_11a8->field_0 + 8);
          pNVar4 = in_RSI->ptr;
          pNVar5 = in_RSI[1].ptr;
          local_a68._0_4_ = (float)uVar2;
          local_a68._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_a60._0_4_ = (float)uVar3;
          uStack_a60._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_a78._0_4_ = SUB84(pNVar4,0);
          local_a78._4_4_ = (float)((ulong)pNVar4 >> 0x20);
          uStack_a70._0_4_ = SUB84(pNVar5,0);
          uStack_a70._4_4_ = (float)((ulong)pNVar5 >> 0x20);
          local_8f8 = (float)local_a68 + (float)local_a78;
          fStack_8f4 = local_a68._4_4_ + local_a78._4_4_;
          fStack_8f0 = (float)uStack_a60 + (float)uStack_a70;
          fStack_8ec = uStack_a60._4_4_ + uStack_a70._4_4_;
          local_8e0 = &local_11c8;
          local_11c8 = CONCAT44(fStack_8f4,local_8f8);
          uStack_11c0 = CONCAT44(fStack_8ec,fStack_8f0);
          local_e08 = &local_11c8;
          local_b40 = &local_e18;
          local_a8 = local_1190 + 1;
          local_e00 = local_1198;
          local_b48 = local_e08;
          local_a78 = pNVar4;
          uStack_a70 = pNVar5;
          local_a68 = uVar2;
          uStack_a60 = uVar3;
          local_a0 = local_1198;
          local_e18 = local_11c8;
          uStack_e10 = uStack_11c0;
          if (local_1188 < local_a8) {
            uVar6 = local_a8;
            if (local_1188 != 0) {
              local_b0 = local_1188;
              while (local_b0 < local_a8) {
                local_c0[1] = 1;
                local_c0[0] = local_b0 << 1;
                puVar10 = std::max<unsigned_long>(local_c0 + 1,local_c0);
                local_b0 = *puVar10;
              }
              local_98 = local_b0;
              uVar6 = local_98;
            }
          }
          else {
            uVar6 = local_1188;
          }
          local_98 = uVar6;
          local_2b8 = local_98;
          uVar6 = uVar1;
          uVar7 = local_1190;
          if (uVar1 < local_1190) {
            while (local_2c0 = uVar6, uVar7 = uVar1, local_2c0 < local_1190) {
              uVar6 = local_2c0 + 1;
            }
          }
          local_1190 = uVar7;
          local_2a8 = local_1198;
          if (local_98 == local_1188) {
            for (local_2c8 = local_1190; local_1190 = uVar1, local_2c8 < uVar1;
                local_2c8 = local_2c8 + 1) {
              local_290 = (void *)((long)local_1180 + local_2c8 * 0x10);
            }
          }
          else {
            local_2d0 = local_1180;
            local_280 = local_98;
            local_2b0 = uVar1;
            local_278 = local_1198;
            local_1180 = alignedMalloc((size_t)in_stack_ffffffffffffe818,
                                       (size_t)in_stack_ffffffffffffe810);
            for (local_2d8 = 0; local_2d8 < local_1190; local_2d8 = local_2d8 + 1) {
              local_298 = (undefined8 *)((long)local_1180 + local_2d8 * 0x10);
              local_2a0 = (undefined8 *)((long)local_2d0 + local_2d8 * 0x10);
              uVar2 = local_2a0[1];
              *local_298 = *local_2a0;
              local_298[1] = uVar2;
            }
            for (local_2e0 = local_1190; local_2e0 < local_2b0; local_2e0 = local_2e0 + 1) {
              local_288 = (void *)((long)local_1180 + local_2e0 * 0x10);
            }
            local_270 = local_1188;
            local_268 = local_2d0;
            local_260 = local_1198;
            alignedFree(in_stack_ffffffffffffe808);
            local_1190 = local_2b0;
            local_1188 = local_2b8;
          }
          local_b50 = (undefined8 *)((long)local_1180 + local_1190 * 0x10);
          local_b58 = &local_e18;
          *local_b50 = local_e18;
          local_b50[1] = uStack_e10;
          local_2b0 = local_1190;
          local_1190 = local_1190 + 1;
        }
        local_ff0 = &local_1178;
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back(in_stack_ffffffffffffe810,(value_type *)in_stack_ffffffffffffe808);
        local_d98 = local_1198;
        for (local_5c0 = 0; local_5c0 < local_1190; local_5c0 = local_5c0 + 1) {
        }
        local_5b0 = local_1188;
        local_5a8 = local_1180;
        local_5b8 = local_d98;
        local_5a0 = local_d98;
        alignedFree(in_stack_ffffffffffffe808);
        local_1180 = (void *)0x0;
        local_1188 = 0;
        local_1190 = 0;
      }
      local_fe0 = &local_1178;
      if (local_1178 != (long *)0x0) {
        (**(code **)(*local_1178 + 0x18))();
      }
    }
    else {
      local_1168 = 0;
      while( true ) {
        uVar1 = local_1168;
        local_1020 = &local_1160;
        sVar9 = std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                        *)(local_1160 + 0xd));
        if (sVar9 <= uVar1) break;
        local_1028 = &local_1160;
        pvVar8 = std::
                 vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)(local_1160 + 0xd),local_1168);
        local_1170 = pvVar8->ptr;
        if (local_1170 != (Node *)0x0) {
          (*(local_1170->super_RefCount)._vptr_RefCount[2])();
        }
        set_motion_vector(in_RSI,local_13e0);
        if (local_1170 != (Node *)0x0) {
          (*(local_1170->super_RefCount)._vptr_RefCount[3])();
        }
        local_1168 = local_1168 + 1;
      }
    }
    local_1018 = &local_1160;
    if (local_1160 != (long *)0x0) {
      (**(code **)(*local_1160 + 0x18))();
    }
  }
  else {
    local_1058 = &stack0xffffffffffffeec0;
    local_1158 = *(long **)((long)&local_13e0[9].field_0 + 8);
    if (local_1158 != (long *)0x0) {
      (**(code **)(*local_1158 + 0x10))();
    }
    set_motion_vector(in_RSI,local_13e0);
    if (local_1158 != (long *)0x0) {
      (**(code **)(*local_1158 + 0x18))();
    }
  }
  local_1050 = &stack0xffffffffffffeec0;
  if (local_13e0 != (Vec3fa *)0x0) {
    (**(code **)(*(long *)&local_13e0->field_0 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::set_motion_vector(Ref<SceneGraph::Node> node, const Vec3fa& dP)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      set_motion_vector(xfmNode->child, dP);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_motion_vector(groupNode->children[i],dP);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      avector<Vec3ff> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+Vec3ff(dP,0.0f));
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      avector<Vec3ff> positions1;
      for (auto& P : mesh->positions.back())
        positions1.push_back(P+Vec3ff(dP,0.0f));
      mesh->positions.push_back(std::move(positions1));

      if (mesh->normals.size())
        mesh->normals.push_back(mesh->normals[0]);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back())
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
  }